

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

cmTarget * __thiscall
cmLocalGenerator::AddUtilityCommand
          (cmLocalGenerator *this,string *utilityName,bool excludeFromAll,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  cmCustomCommand *this_00;
  cmTarget *this_01;
  cmCustomCommandLines *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_30;
  cmListFileBacktrace local_28;
  
  this_01 = cmMakefile::AddNewUtilityTarget(this->Makefile,utilityName,excludeFromAll);
  cmTarget::SetIsGeneratorProvided(this_01,true);
  pcVar1 = cmCustomCommand::GetCommandLines
                     ((cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  if (((pcVar1->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pcVar1->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pvVar2 = cmCustomCommand::GetDepends_abi_cxx11_
                         ((cc->_M_t).
                          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                          .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl),
     (pvVar2->
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     )._M_impl.super__Vector_impl_data._M_start ==
     (pvVar2->
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     )._M_impl.super__Vector_impl_data._M_finish)) {
    return this_01;
  }
  this_00 = (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
            ._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
            super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
  local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (this->DirectoryBacktrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (this->DirectoryBacktrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
       TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  cmCustomCommand::SetBacktrace(this_00,&local_28);
  if (local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_30._M_head_impl =
       (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
       .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
       super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
  (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
  detail::AddUtilityCommand
            (this,Generator,this_01,
             (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_30);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_30);
  return this_01;
}

Assistant:

cmTarget* cmLocalGenerator::AddUtilityCommand(
  const std::string& utilityName, bool excludeFromAll,
  std::unique_ptr<cmCustomCommand> cc)
{
  cmTarget* target =
    this->Makefile->AddNewUtilityTarget(utilityName, excludeFromAll);
  target->SetIsGeneratorProvided(true);

  if (cc->GetCommandLines().empty() && cc->GetDepends().empty()) {
    return target;
  }

  cc->SetBacktrace(this->DirectoryBacktrace);
  detail::AddUtilityCommand(*this, cmCommandOrigin::Generator, target,
                            std::move(cc));

  return target;
}